

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall
nn::ESoinn::findClustersMCL
          (ESoinn *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *clusters)

{
  ConcreteLogger *this_00;
  byte bVar1;
  bool bVar2;
  char *__command;
  runtime_error *this_01;
  istream *piVar3;
  unsigned_long uVar4;
  byte local_422;
  value_type_conflict3 local_3dc;
  reference pbStack_3d8;
  uint32_t neuron_num;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> one_cluster;
  undefined1 local_388 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  long local_308;
  ifstream fi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string command;
  undefined1 local_98 [8];
  string options;
  undefined1 local_70 [8];
  string output_mcl;
  allocator local_39;
  string local_38;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_18;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *clusters_local;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_18 = clusters;
  clusters_local =
       (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"findClusterMCL function",&local_39);
  logger::ConcreteLogger::debug(this_00,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  exportEdgesFile(this,(string *)output_src_mcl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,"mcl_clusters.tmp",(allocator *)(options.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(options.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_98," -I 3.0 --abc -o ",
             (allocator *)(command.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(command.field_2._M_local_buf + 0xf));
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 mcl_path_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 output_src_mcl_abi_cxx11_);
  std::operator+(&local_e0,&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::ifstream::ifstream(&local_308,(string *)local_70,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_308 + *(long *)(local_308 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_348,"Can\'t read mcl output file. File ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+(&local_328,&local_348," is not found");
    std::runtime_error::runtime_error(this_01,(string *)&local_328);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string
            ((string *)
             &items.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_308,
                        (string *)
                        &items.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    local_422 = 0;
    if (bVar2) {
      local_422 = std::__cxx11::string::empty();
      local_422 = local_422 ^ 0xff;
    }
    if ((local_422 & 1) == 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_388);
    boost::algorithm::is_any_of<char[2]>
              ((is_any_ofF<char> *)
               &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(char (*) [2])0x1ca473);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_388,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &items.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (is_any_ofF<char> *)
               &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
              ((is_any_ofF<char> *)
               &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_388);
    s = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&s), bVar2) {
      pbStack_3d8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
      uVar4 = std::__cxx11::stoul(pbStack_3d8,(size_t *)0x0,10);
      local_3dc = (value_type_conflict3)uVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,&local_3dc);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(local_18,(value_type *)&__range2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
  }
  std::__cxx11::string::~string
            ((string *)
             &items.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(&local_308);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void ESoinn::findClustersMCL(std::vector<std::vector<uint32_t>>& clusters) const
    {
        log_netw->debug("findClusterMCL function");
        
        //prepare input data for mcl
        exportEdgesFile(output_src_mcl);
    
        //run mcl algorithm
        std::string output_mcl = "mcl_clusters.tmp";    
        std::string options = " -I 3.0 --abc -o ";
        std::string command = mcl_path + output_src_mcl + options + output_mcl;
        system(command.c_str());
        
        //read output mcl file and form results
        std::ifstream fi(output_mcl);
        if (not fi)
            throw std::runtime_error("Can't read mcl output file. File " + output_mcl + " is not found");
        
        std::string line;
        while (std::getline(fi, line) and !line.empty())
        {
            std::vector<std::string> items;
            boost::split(items, line, boost::is_any_of("\t"));
            std::vector<uint32_t> one_cluster;
            for (const std::string& s: items)
            {
                uint32_t neuron_num = std::stoul(s);
                one_cluster.push_back(neuron_num);
            }
            clusters.push_back(one_cluster);
        }

        //remove temporary files
        //std::remove(output_src_mcl.c_str());
        //std::remove(output_mcl.c_str());
    }